

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

float __thiscall wasm::Random::getFloat(Random *this)

{
  ushort uVar1;
  int16_t iVar2;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  float local_1c;
  
  uVar1 = get16(this);
  iVar2 = get16(this);
  local_38.i32 = (int)iVar2 | (uint)uVar1 << 0x10;
  local_28 = 2;
  local_1c = (float)local_38.i32;
  wasm::Literal::~Literal((Literal *)&local_38.func);
  return local_1c;
}

Assistant:

float Random::getFloat() { return Literal(get32()).reinterpretf32(); }